

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_33386e4::RawDescriptor::RawDescriptor(RawDescriptor *this,CScript *script)

{
  long lVar1;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *in_RSI;
  DescriptorImpl *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff98;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *pubkeys;
  DescriptorImpl *this_00;
  char *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pubkeys = in_RSI;
  this_00 = in_RDI;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::vector((vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
            *)in_stack_ffffffffffffff68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_ffffffffffffffb0,(allocator<char> *)this_00);
  DescriptorImpl::DescriptorImpl(this_00,pubkeys,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string(in_stack_ffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(in_RSI);
  (in_RDI->super_Descriptor)._vptr_Descriptor = (_func_int **)&PTR__RawDescriptor_023cd0c8;
  CScript::CScript((CScript *)in_stack_ffffffffffffff68,(CScript *)0x19fd1c4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RawDescriptor(CScript script) : DescriptorImpl({}, "raw"), m_script(std::move(script)) {}